

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackRemover.cpp
# Opt level: O0

void __thiscall phaeton::StackRemover::transformAssignments(StackRemover *this)

{
  CodeGen *Gen;
  IdentifierExpr *this_00;
  ExpressionNodeBuilder *this_01;
  list<phaeton::CodeGen::Assignment,_std::allocator<phaeton::CodeGen::Assignment>_> *plVar1;
  IdentifierExpr *pIVar2;
  mapped_type pIVar3;
  string *Name;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  ExprDims *ED;
  TupleList *Pairs;
  mapped_type *ppIVar7;
  pointer pAVar8;
  size_type sVar9;
  ExpressionNode *pEVar10;
  ExpressionNode *RHS_1;
  ExpressionNode *local_1c8;
  ExpressionNode *LHS_1;
  _List_node_base *local_1b8;
  _List_node_base *local_1b0;
  const_iterator local_1a8;
  _List_node_base *local_1a0;
  value_type local_198;
  const_iterator local_188;
  key_type local_180;
  string local_160;
  string local_140;
  uint local_11c;
  IdentifierExpr *pIStack_118;
  uint J;
  IdentifierExpr *Id;
  ExpressionNode *Child;
  undefined1 local_100 [4];
  uint I;
  string *local_e0;
  string *LHSName;
  iterator local_d0;
  _List_iterator<phaeton::CodeGen::Assignment> NextPos;
  ExpressionNode *RHS;
  IdentifierExpr *LHS;
  _List_node_base *local_b0;
  LiftPredicate local_98;
  undefined1 local_78 [8];
  ExprTreeLifter Lifter;
  anon_class_1_0_00000001 *nodeLiftPredicate;
  StackRemover *this_local;
  
  Gen = this->CG;
  std::function<bool(phaeton::ExpressionNode_const*,phaeton::ExpressionNode_const*)>::
  function<phaeton::StackRemover::transformAssignments()::__0_const&,void>
            ((function<bool(phaeton::ExpressionNode_const*,phaeton::ExpressionNode_const*)> *)
             &local_98,(anon_class_1_0_00000001 *)((long)&Lifter.IsNodeToBeLifted._M_invoker + 7));
  ExprTreeLifter::ExprTreeLifter((ExprTreeLifter *)local_78,Gen,&local_98);
  std::function<bool_(const_phaeton::ExpressionNode_*,_const_phaeton::ExpressionNode_*)>::~function
            (&local_98);
  ExprTreeLifter::transformAssignments((ExprTreeLifter *)local_78);
  local_b0 = (_List_node_base *)
             std::__cxx11::
             list<phaeton::CodeGen::Assignment,_std::allocator<phaeton::CodeGen::Assignment>_>::
             begin(this->Assignments);
  (this->CurrentPos)._M_node = local_b0;
  while( true ) {
    LHS = (IdentifierExpr *)
          std::__cxx11::
          list<phaeton::CodeGen::Assignment,_std::allocator<phaeton::CodeGen::Assignment>_>::end
                    (this->Assignments);
    bVar4 = std::operator!=(&this->CurrentPos,(_Self *)&LHS);
    if (!bVar4) break;
    pAVar8 = std::_List_iterator<phaeton::CodeGen::Assignment>::operator->(&this->CurrentPos);
    this_00 = (IdentifierExpr *)pAVar8->LHS;
    pAVar8 = std::_List_iterator<phaeton::CodeGen::Assignment>::operator->(&this->CurrentPos);
    NextPos._M_node = (_List_node_base *)pAVar8->RHS;
    uVar6 = (*((ExpressionNode *)NextPos._M_node)->_vptr_ExpressionNode[0xb])();
    if ((uVar6 & 1) == 0) {
      std::_List_iterator<phaeton::CodeGen::Assignment>::operator++(&this->CurrentPos);
    }
    else {
      LHSName = (string *)(this->CurrentPos)._M_node;
      local_d0._M_node =
           (_List_node_base *)
           std::next<std::_List_iterator<phaeton::CodeGen::Assignment>>
                     ((_List_iterator<phaeton::CodeGen::Assignment>)LHSName,1);
      (*(this_00->super_ExpressionNode)._vptr_ExpressionNode[7])(local_100);
      local_e0 = (string *)local_100;
      for (Child._4_4_ = 0; uVar6 = Child._4_4_,
          uVar5 = ExpressionNode::getNumChildren((ExpressionNode *)NextPos._M_node), uVar6 < uVar5;
          Child._4_4_ = Child._4_4_ + 1) {
        Id = (IdentifierExpr *)
             ExpressionNode::getChild((ExpressionNode *)NextPos._M_node,Child._4_4_);
        Name = local_e0;
        this_01 = this->ExprNodeBuilder;
        ED = ExpressionNode::getDims((ExpressionNode *)this_00);
        pIStack_118 = ExpressionNodeBuilder::createIdentifierExpr(this_01,Name,ED);
        for (local_11c = 0; uVar6 = local_11c,
            uVar5 = (*(this_00->super_ExpressionNode)._vptr_ExpressionNode[9])(),
            pIVar2 = pIStack_118, uVar6 < uVar5; local_11c = local_11c + 1) {
          (*(this_00->super_ExpressionNode)._vptr_ExpressionNode[8])
                    (&local_140,this_00,(ulong)local_11c);
          IdentifierExpr::addIndex(pIVar2,&local_140);
          std::__cxx11::string::~string((string *)&local_140);
        }
        std::__cxx11::to_string(&local_160,(ulong)Child._4_4_);
        IdentifierExpr::addIndex(pIVar2,&local_160);
        std::__cxx11::string::~string((string *)&local_160);
        bVar4 = IdentifierExpr::getPermute(this_00);
        if (bVar4) {
          IdentifierExpr::setPermute(pIStack_118,true);
          pIVar2 = pIStack_118;
          Pairs = IdentifierExpr::getIndexPairs(this_00);
          IdentifierExpr::setIndexPairs(pIVar2,Pairs);
        }
        uVar6 = (*(Id->super_ExpressionNode)._vptr_ExpressionNode[6])();
        if (((uVar6 & 1) == 0) ||
           (bVar4 = isDeclaredId(this,&Id->super_ExpressionNode), pIVar3 = pIStack_118, bVar4)) {
          plVar1 = this->Assignments;
          std::_List_const_iterator<phaeton::CodeGen::Assignment>::_List_const_iterator
                    (&local_188,&local_d0);
          local_198.LHS = &pIStack_118->super_ExpressionNode;
          local_198.RHS = &Id->super_ExpressionNode;
          local_1a0 = (_List_node_base *)
                      std::__cxx11::
                      list<phaeton::CodeGen::Assignment,_std::allocator<phaeton::CodeGen::Assignment>_>
                      ::insert(plVar1,local_188,&local_198);
        }
        else {
          (*(Id->super_ExpressionNode)._vptr_ExpressionNode[7])(&local_180);
          ppIVar7 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_phaeton::IdentifierExpr_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_phaeton::IdentifierExpr_*>_>_>
                    ::operator[](&this->Replacements,&local_180);
          *ppIVar7 = pIVar3;
          std::__cxx11::string::~string((string *)&local_180);
        }
      }
      plVar1 = this->Assignments;
      std::_List_const_iterator<phaeton::CodeGen::Assignment>::_List_const_iterator
                (&local_1a8,&this->CurrentPos);
      local_1b0 = (_List_node_base *)
                  std::__cxx11::
                  list<phaeton::CodeGen::Assignment,_std::allocator<phaeton::CodeGen::Assignment>_>
                  ::erase(plVar1,local_1a8);
      (this->CurrentPos)._M_node = local_d0._M_node;
      std::__cxx11::string::~string((string *)local_100);
    }
  }
  local_1b8 = (_List_node_base *)
              std::__cxx11::
              list<phaeton::CodeGen::Assignment,_std::allocator<phaeton::CodeGen::Assignment>_>::
              begin(this->Assignments);
  (this->CurrentPos)._M_node = local_1b8;
  while( true ) {
    LHS_1 = (ExpressionNode *)
            std::__cxx11::
            list<phaeton::CodeGen::Assignment,_std::allocator<phaeton::CodeGen::Assignment>_>::end
                      (this->Assignments);
    bVar4 = std::operator!=(&this->CurrentPos,(_Self *)&LHS_1);
    if (!bVar4) {
      ExprTreeLifter::~ExprTreeLifter((ExprTreeLifter *)local_78);
      return;
    }
    pAVar8 = std::_List_iterator<phaeton::CodeGen::Assignment>::operator->(&this->CurrentPos);
    local_1c8 = pAVar8->LHS;
    uVar6 = (*local_1c8->_vptr_ExpressionNode[6])();
    if ((uVar6 & 1) == 0) break;
    (*local_1c8->_vptr_ExpressionNode[7])(&RHS_1);
    sVar9 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_phaeton::IdentifierExpr_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_phaeton::IdentifierExpr_*>_>_>
            ::count(&this->Replacements,(key_type *)&RHS_1);
    std::__cxx11::string::~string((string *)&RHS_1);
    if (sVar9 != 0) {
      pEVar10 = buildReplacement(this,local_1c8,true);
      pAVar8 = std::_List_iterator<phaeton::CodeGen::Assignment>::operator->(&this->CurrentPos);
      pAVar8->LHS = pEVar10;
    }
    pAVar8 = std::_List_iterator<phaeton::CodeGen::Assignment>::operator->(&this->CurrentPos);
    pEVar10 = pAVar8->RHS;
    setParent(this,(ExpressionNode *)0x0);
    setChildIndex(this,-1);
    (*pEVar10->_vptr_ExpressionNode[5])(pEVar10,this);
    std::_List_iterator<phaeton::CodeGen::Assignment>::operator++(&this->CurrentPos);
  }
  __assert_fail("LHS->isIdentifier()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/lijiansong[P]Phaeton/lib/Opt/StackRemover.cpp"
                ,0xa0,"void phaeton::StackRemover::transformAssignments()");
}

Assistant:

void StackRemover::transformAssignments() {
  // 1. We need to lift all tensor stack expressions up to the top level.
  const auto &nodeLiftPredicate = [](const ExpressionNode *Node,
                                     const ExpressionNode *Root) {
    return Node->isStackExpr();
  };
  ExprTreeLifter Lifter(CG, nodeLiftPredicate);
  Lifter.transformAssignments();

  // 2. We need to find all stack expressions and remove them.
  CurrentPos = Assignments.begin();
  while (CurrentPos != Assignments.end()) {
    IdentifierExpr *LHS = static_cast<IdentifierExpr *>(CurrentPos->LHS);
    ExpressionNode *RHS = CurrentPos->RHS;

    if (!RHS->isStackExpr()) {
      ++CurrentPos;
      continue;
    }

    const auto NextPos = std::next(CurrentPos);
    const std::string &LHSName = LHS->getName();

    for (unsigned I = 0; I < RHS->getNumChildren(); ++I) {
      ExpressionNode *Child = RHS->getChild(I);

      // Note here we build 'LHS' for assigning the i-th child.
      IdentifierExpr *Id =
          ExprNodeBuilder->createIdentifierExpr(LHSName, LHS->getDims());
      for (unsigned J = 0; J < LHS->getNumIndices(); ++J) {
        Id->addIndex(LHS->getIndex(J));
      }
      Id->addIndex(std::to_string((long long)I));
      if (LHS->getPermute()) {
        Id->setPermute(true);
        Id->setIndexPairs(LHS->getIndexPairs());
      }

      if (Child->isIdentifier() && !isDeclaredId(Child)) {
        // The 'Child' node is an Identifier that has not been declared
        // explicitly in Phaeton program. Hence, this Identifier must have
        // been inserted by a transformation, here the transformation is
        // performed by lifting stack expressions to the top level. Therefore,
        // the Identifier only has a single use, i.e. inside the current stack
        // expression. Since the identifier has been inserted by a
        // transformation, it also has only one single definition.
        Replacements[Child->getName()] = Id;
      } else {
        // The assignemnt of the 'Child' node is inserted before next
        // assignment in Phaeton program. Since stacks have been lifted to the
        // top level, the expression tree rooted at 'Child' node does not
        // contain any stack expressions. Hence, current transformation
        // need not be applied recursively to the new assignment.
        Assignments.insert(NextPos, {Id, Child});
      }
    }

    Assignments.erase(CurrentPos);
    CurrentPos = NextPos;
  }

  // 3. Now we need to apply the replacements.
  for (CurrentPos = Assignments.begin(); CurrentPos != Assignments.end();
       ++CurrentPos) {
    // Here we handle replacements of defs, i.e. replacements on 'LHS'.
    {
      ExpressionNode *LHS = CurrentPos->LHS;
      assert(LHS->isIdentifier());
      if (Replacements.count(LHS->getName()))
        CurrentPos->LHS = buildReplacement(LHS, /* IsForLHS = */ true);
    }

    // Here we handle replacements of uses, i.e. replacements on 'RHS'.
    {
      ExpressionNode *RHS = CurrentPos->RHS;
      setParent(nullptr);
      setChildIndex(-1);
      RHS->transform(this);
    }
  }
}